

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

void __thiscall tonk::SessionOutgoing::Shutdown(SessionOutgoing *this)

{
  ostringstream *poVar1;
  Channel *pCVar2;
  SiameseResult SVar3;
  OutputWorker *pOVar4;
  uint64_t stats [9];
  LogStringBuffer local_1b0;
  
  SVar3 = siamese_encoder_stats(this->FECEncoder,stats,9);
  pCVar2 = (this->Deps).Logger;
  if (SVar3 == Siamese_Success) {
    if (1 < (int)pCVar2->ChannelMinLevel) goto LAB_00123fea;
    local_1b0.ChannelName = pCVar2->ChannelName;
    poVar1 = &local_1b0.LogStream;
    local_1b0.LogLevel = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&pCVar2->Prefix);
    std::operator<<((ostream *)poVar1,"Siamese encoder stats: Memory used = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," KB, Originals sent = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,", Recoveries sent = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,&local_1b0);
  }
  else {
    if (4 < (int)pCVar2->ChannelMinLevel) goto LAB_00123fea;
    local_1b0.ChannelName = pCVar2->ChannelName;
    poVar1 = &local_1b0.LogStream;
    local_1b0.LogLevel = Error;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&pCVar2->Prefix);
    std::operator<<((ostream *)poVar1,"Unable to retrieve siamese encoder stats");
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,&local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.LogStream);
LAB_00123fea:
  pCVar2 = (this->Deps).Logger;
  local_1b0.ChannelName = (char *)&this->super_OutgoingQueueCommon;
  std::recursive_mutex::lock((recursive_mutex *)local_1b0.ChannelName);
  pktalloc::Allocator::GetMemoryAllocatedBytes
            (&(this->super_OutgoingQueueCommon).WriteAllocator.Allocator);
  Locker::~Locker((Locker *)&local_1b0);
  if ((int)pCVar2->ChannelMinLevel < 2) {
    local_1b0.ChannelName = pCVar2->ChannelName;
    poVar1 = &local_1b0.LogStream;
    local_1b0.LogLevel = Debug;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&pCVar2->Prefix);
    std::operator<<((ostream *)poVar1,"Write allocator memory used: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," KB");
    pOVar4 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar4,&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  siamese_encoder_free(this->FECEncoder);
  return;
}

Assistant:

void SessionOutgoing::Shutdown()
{
    uint64_t stats[SiameseEncoderStats_Count];
    SiameseResult result = siamese_encoder_stats(FECEncoder, stats, SiameseEncoderStats_Count);
    if (result != Siamese_Success) {
        Deps.Logger->Error("Unable to retrieve siamese encoder stats");
    }
    else {
        Deps.Logger->Debug("Siamese encoder stats:" \
            " Memory used = ", stats[SiameseEncoderStats_MemoryUsed] / 1000, " KB" \
            ", Originals sent = ", stats[SiameseEncoderStats_OriginalCount],
            ", Recoveries sent = ", stats[SiameseEncoderStats_RecoveryCount]);
    }

    Deps.Logger->Debug("Write allocator memory used: ",
        WriteAllocator.GetUsedMemory() / 1000, " KB");

    siamese_encoder_free(FECEncoder);

    // Note: Allocations are freed automatically by FECEncoder object
}